

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

shared_ptr<PathTracer> __thiscall
PathTracer::Create(PathTracer *this,shared_ptr<Octree> *octree,shared_ptr<Camera> *camera,
                  shared_ptr<Lighting> *lighting,shared_ptr<myvk::CommandPool> *command_pool)

{
  element_type *peVar1;
  PathTracer *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<PathTracer> sVar4;
  
  std::make_shared<PathTracer>();
  std::__shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2> *)
             (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &octree->super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2> *)
             &((this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_range,&camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2> *)
             &((this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_descriptor_pool,&lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)
  ;
  peVar1 = (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined4 *)
   &peVar1[5].m_descriptor_pool.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = 4;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  Sobol::Initialize((Sobol *)&peVar1->m_descriptor_set_layout,
                    (shared_ptr<myvk::Device> *)CONCAT44(extraout_var,iVar3));
  pPVar2 = (PathTracer *)
           (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_noise_images(pPVar2,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_00,iVar3));
  set_noise_image((PathTracer *)
                  (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ,command_pool);
  pPVar2 = (PathTracer *)
           (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_descriptor(pPVar2,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_01,iVar3));
  pPVar2 = (PathTracer *)
           (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_pipeline(pPVar2,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_02,iVar3));
  sVar4.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<PathTracer>)sVar4.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PathTracer> PathTracer::Create(const std::shared_ptr<Octree> &octree,
                                               const std::shared_ptr<Camera> &camera,
                                               const std::shared_ptr<Lighting> &lighting,
                                               const std::shared_ptr<myvk::CommandPool> &command_pool) {
	std::shared_ptr<PathTracer> ret = std::make_shared<PathTracer>();
	ret->m_octree_ptr = octree;
	ret->m_camera_ptr = camera;
	ret->m_lighting_ptr = lighting;

	ret->m_bounce = kDefaultBounce;

	ret->m_sobol.Initialize(command_pool->GetDevicePtr());
	ret->create_noise_images(command_pool->GetDevicePtr());
	ret->set_noise_image(command_pool);
	ret->create_descriptor(command_pool->GetDevicePtr());
	ret->create_pipeline(command_pool->GetDevicePtr());

	return ret;
}